

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::parse_delete(CTcPrsNode *subexpr)

{
  int iVar1;
  CTPNDelete *this;
  CTcPrsNode *in_stack_ffffffffffffffd8;
  
  iVar1 = CTcParser::get_syntax_only(G_prs);
  if (iVar1 == 0) {
    CTcTokenizer::log_warning(0x2aff);
  }
  this = (CTPNDelete *)CTcPrsAllocObj::operator_new(0x2575e3);
  CTPNDelete::CTPNDelete(this,in_stack_ffffffffffffffd8);
  return (CTcPrsNode *)this;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_delete(CTcPrsNode *subexpr)
{
    /* the delete operator is obsolete in TADS 3 - warn about it */
    if (!G_prs->get_syntax_only())
        G_tok->log_warning(TCERR_DELETE_OBSOLETE);

    /* create the deletion node */
    return new CTPNDelete(subexpr);
}